

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this,QByteArray *array)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  QBuffer *this_01;
  
  this_00._M_head_impl = (QXmlStreamWriterPrivate *)operator_new(0xe0);
  QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack
            ((QXmlStreamPrivateTagStack *)this_00._M_head_impl);
  (((QXmlStreamPrivateTagStack *)&(this_00._M_head_impl)->q_ptr)->namespaceDeclarations).data =
       (NamespaceDeclaration *)this;
  (this_00._M_head_impl)->device = (QIODevice *)0x0;
  (this_00._M_head_impl)->stringDevice = (QString *)0x0;
  *(ushort *)&(((QString *)&(this_00._M_head_impl)->field_0x78)->d).d =
       *(ushort *)&(((QString *)&(this_00._M_head_impl)->field_0x78)->d).d & 0xfc00;
  ((this_00._M_head_impl)->autoFormattingIndent)._M_dataplus =
       (_Alloc_hider)&((this_00._M_head_impl)->autoFormattingIndent).field_2;
  *(undefined4 *)&((this_00._M_head_impl)->autoFormattingIndent).field_2 = 0x20202020;
  ((this_00._M_head_impl)->autoFormattingIndent)._M_string_length = 4;
  *(undefined1 *)((long)((this_00._M_head_impl)->autoFormattingIndent).field_2._M_local_buf + 4) = 0
  ;
  ((this_00._M_head_impl)->emptyNamespace).prefix.m_string = 0;
  ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::Tag> *)
  &((this_00._M_head_impl)->emptyNamespace).prefix.m_pos)->data = (Tag *)0x0;
  ((this_00._M_head_impl)->emptyNamespace).prefix.m_size = 0;
  ((this_00._M_head_impl)->emptyNamespace).namespaceUri.m_string = (QString *)0x0;
  (((QXmlStreamPrivateTagStack *)&((this_00._M_head_impl)->emptyNamespace).namespaceUri.m_pos)->
  namespaceDeclarations).data = (NamespaceDeclaration *)0x0;
  ((this_00._M_head_impl)->emptyNamespace).namespaceUri.m_size = 0;
  (this_00._M_head_impl)->lastNamespaceDeclaration = 1;
  *(undefined4 *)&(((QString *)&(this_00._M_head_impl)->namespacePrefixCount)->d).d = 0;
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>.
  super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl = this_00._M_head_impl;
  this_01 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_01,array,(QObject *)0x0);
  (this_00._M_head_impl)->device = (QIODevice *)this_01;
  (*(this_01->super_QIODevice).super_QObject._vptr_QObject[0xd])(this_01,2);
  *(byte *)&(((QString *)&(this_00._M_head_impl)->field_0x78)->d).d =
       *(byte *)&(((QString *)&(this_00._M_head_impl)->field_0x78)->d).d | 1;
  return;
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter(QByteArray *array)
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
    Q_D(QXmlStreamWriter);
    d->device = new QBuffer(array);
    d->device->open(QIODevice::WriteOnly);
    d->deleteDevice = true;
}